

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderAPI.cpp
# Opt level: O1

IterateResult __thiscall
glcts::GeometryShaderMaxShaderStorageBlocksTest::iterate
          (GeometryShaderMaxShaderStorageBlocksTest *this)

{
  GLuint *pGVar1;
  TestLog *pTVar2;
  uint uVar3;
  GLint GVar4;
  bool bVar5;
  int iVar6;
  deUint32 dVar7;
  GLuint GVar8;
  undefined4 extraout_var;
  NotSupportedError *pNVar10;
  void *pvVar11;
  float *pfVar12;
  int *piVar13;
  ulong uVar14;
  char *description;
  qpTestResult testResult;
  ulong uVar15;
  ulong uVar16;
  char *__end;
  long lVar17;
  bool has_shader_compilation_failed;
  GLint *local_270;
  GLint ssbo_alignment;
  long local_260;
  GLint m_gl_max_shader_storage_buffer_bindings_value;
  int local_250;
  float local_24c;
  char *gs_code_specialized_raw;
  char *fs_code_specialized_raw;
  string vs_code_specialized;
  string gs_code_specialized;
  string fs_code_specialized;
  char *vs_code_specialized_raw;
  GLchar *feedbackVaryings [1];
  GLfloat initial_buffer_data [4];
  undefined1 local_1b0 [8];
  undefined1 local_1a8 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0 [6];
  ios_base local_138 [264];
  long lVar9;
  
  feedbackVaryings[0] = "gl_Position";
  has_shader_compilation_failed = true;
  initial_buffer_data[0] = 0.0;
  initial_buffer_data[1] = 0.0;
  initial_buffer_data[2] = 0.0;
  initial_buffer_data[3] = 0.0;
  ssbo_alignment = 0;
  fs_code_specialized._M_dataplus._M_p = (pointer)&fs_code_specialized.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&fs_code_specialized,0x1b3c1e9,0x1b3c1e9);
  fs_code_specialized_raw = (char *)0x0;
  gs_code_specialized._M_dataplus._M_p = (pointer)&gs_code_specialized.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&gs_code_specialized,0x1b3c1e9,0x1b3c1e9);
  gs_code_specialized_raw = (char *)0x0;
  vs_code_specialized._M_dataplus._M_p = (pointer)&vs_code_specialized.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&vs_code_specialized,0x1b3c1e9);
  vs_code_specialized_raw = (char *)0x0;
  if ((this->super_TestCaseBase).m_is_geometry_shader_extension_supported == false) {
    pNVar10 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (pNVar10,"Geometry shader functionality not supported, skipping",
               fixed_sample_locations_values + 1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
               ,0x765);
    __cxa_throw(pNVar10,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  iVar6 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar9 = CONCAT44(extraout_var,iVar6);
  local_270 = &this->m_gl_max_geometry_shader_storage_blocks_ext_value;
  (**(code **)(lVar9 + 0x868))
            ((this->super_TestCaseBase).m_glExtTokens.MAX_GEOMETRY_SHADER_STORAGE_BLOCKS);
  dVar7 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar7,"glGetIntegerv() failed for GL_MAX_GEOMETRY_SHADER_STORAGE_BLOCKS_EXT pname"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                  ,0x76d);
  m_gl_max_shader_storage_buffer_bindings_value = 0;
  (**(code **)(lVar9 + 0x868))(0x90dd);
  dVar7 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar7,"glGetIntegerv() failed for GL_MAX_SHADER_STORAGE_BUFFER_BINDINGS pname",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                  ,0x773);
  if (*local_270 < 1) {
    local_1b0 = (undefined1  [8])
                ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"GL_MAX_GEOMETRY_SHADER_STORAGE_BLOCKS_EXT query value ",0x36);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[",1);
    std::ostream::operator<<((ostringstream *)local_1a8,*local_270);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "] is less than or equal zero. Shader Storage Blocks in Geometry Shader are not supported."
               ,0x59);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    if (*local_270 == 0) {
      pNVar10 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      local_1b0 = (undefined1  [8])(local_1a8 + 8);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1b0,"GL_MAX_GEOMETRY_SHADER_STORAGE_BLOCKS_EXT is 0","");
      tcu::NotSupportedError::NotSupportedError(pNVar10,(string *)local_1b0);
      __cxa_throw(pNVar10,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
  }
  else {
    if (m_gl_max_shader_storage_buffer_bindings_value < *local_270) {
      local_1b0 = (undefined1  [8])
                  ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"GL_MAX_GEOMETRY_SHADER_STORAGE_BLOCKS_EXT query value ",0x36)
      ;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[",1);
      std::ostream::operator<<((ostringstream *)local_1a8,*local_270);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,
                 "] is greater than GL_MAX_SHADER_STORAGE_BUFFER_BINDINGS query value [",0x45);
      std::ostream::operator<<
                ((ostringstream *)local_1a8,m_gl_max_shader_storage_buffer_bindings_value);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"].",2);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    }
    else {
      GVar8 = (**(code **)(lVar9 + 0x3c8))();
      this->m_po_id = GVar8;
      dVar7 = (**(code **)(lVar9 + 0x800))();
      glu::checkError(dVar7,"glCreateProgram() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                      ,0x79a);
      GVar8 = (**(code **)(lVar9 + 0x3f0))(0x8b30);
      this->m_fs_id = GVar8;
      GVar8 = (**(code **)(lVar9 + 0x3f0))(0x8dd9);
      this->m_gs_id = GVar8;
      GVar8 = (**(code **)(lVar9 + 0x3f0))(0x8b31);
      this->m_vs_id = GVar8;
      dVar7 = (**(code **)(lVar9 + 0x800))();
      glu::checkError(dVar7,"glCreateShader() call(s) failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                      ,0x7a1);
      (**(code **)(lVar9 + 0x14c8))(this->m_po_id,1,feedbackVaryings,0x8c8c);
      dVar7 = (**(code **)(lVar9 + 0x800))();
      glu::checkError(dVar7,"glTransformFeedbackVaryings() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                      ,0x7a6);
      TestCaseBase::specializeShader_abi_cxx11_
                ((string *)local_1b0,&this->super_TestCaseBase,1,&dummy_fs_code);
      std::__cxx11::string::operator=((string *)&fs_code_specialized,(string *)local_1b0);
      pTVar2 = (TestLog *)(local_1a8 + 8);
      if (local_1b0 != (undefined1  [8])pTVar2) {
        operator_delete((void *)local_1b0,local_1a0[0]._M_allocated_capacity + 1);
      }
      fs_code_specialized_raw = fs_code_specialized._M_dataplus._M_p;
      getGSCode_abi_cxx11_((string *)local_1b0,this);
      std::__cxx11::string::operator=((string *)&gs_code_specialized,(string *)local_1b0);
      if (local_1b0 != (undefined1  [8])pTVar2) {
        operator_delete((void *)local_1b0,local_1a0[0]._M_allocated_capacity + 1);
      }
      gs_code_specialized_raw = gs_code_specialized._M_dataplus._M_p;
      TestCaseBase::specializeShader_abi_cxx11_
                ((string *)local_1b0,&this->super_TestCaseBase,1,&dummy_vs_code);
      std::__cxx11::string::operator=((string *)&vs_code_specialized,(string *)local_1b0);
      if (local_1b0 != (undefined1  [8])pTVar2) {
        operator_delete((void *)local_1b0,local_1a0[0]._M_allocated_capacity + 1);
      }
      vs_code_specialized_raw = vs_code_specialized._M_dataplus._M_p;
      bVar5 = TestCaseBase::buildProgram
                        (&this->super_TestCaseBase,this->m_po_id,this->m_gs_id,1,
                         &gs_code_specialized_raw,this->m_vs_id,1,&vs_code_specialized_raw,
                         this->m_fs_id,1,&fs_code_specialized_raw,&has_shader_compilation_failed);
      if (bVar5) {
        (**(code **)(lVar9 + 0x868))(0x90df,&ssbo_alignment);
        dVar7 = (**(code **)(lVar9 + 0x800))();
        glu::checkError(dVar7,"glGetIntegerv() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                        ,0x7bf);
        GVar4 = ssbo_alignment;
        iVar6 = ssbo_alignment + 3;
        if (-1 < ssbo_alignment) {
          iVar6 = ssbo_alignment;
        }
        uVar3 = *local_270;
        local_260 = (long)(int)(uVar3 * ssbo_alignment);
        uVar14 = 0xffffffffffffffff;
        if (-1 < (int)(uVar3 * ssbo_alignment)) {
          uVar14 = local_260 * 4;
        }
        pvVar11 = operator_new__(uVar14);
        if ((GVar4 & 3U) == 0) {
          local_250 = iVar6 >> 2;
          if (0 < (int)uVar3) {
            iVar6 = 0;
            uVar14 = 0;
            do {
              uVar14 = uVar14 + 1;
              *(int *)((long)pvVar11 + (long)iVar6 * 4) = (int)uVar14;
              iVar6 = iVar6 + local_250;
            } while (uVar3 != uVar14);
          }
          pGVar1 = &this->m_ssbo_id;
          (**(code **)(lVar9 + 0x6c8))(1,pGVar1);
          dVar7 = (**(code **)(lVar9 + 0x800))();
          glu::checkError(dVar7,"glGenBuffers() call failed.",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                          ,0x7d9);
          (**(code **)(lVar9 + 0x40))(0x90d2,*pGVar1);
          dVar7 = (**(code **)(lVar9 + 0x800))();
          glu::checkError(dVar7,"glBindBuffer() call failed for GL_SHADER_STORAGE_BUFFER pname.",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                          ,0x7dc);
          (**(code **)(lVar9 + 0x150))(0x90d2,local_260,pvVar11,0x88ea);
          dVar7 = (**(code **)(lVar9 + 0x800))();
          glu::checkError(dVar7,"glBufferData() call failed.",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                          ,0x7df);
          operator_delete__(pvVar11);
          if (0 < *local_270) {
            iVar6 = 0;
            do {
              (**(code **)(lVar9 + 0x50))(0x90d2,iVar6,*pGVar1,ssbo_alignment * iVar6,4);
              dVar7 = (**(code **)(lVar9 + 0x800))();
              glu::checkError(dVar7,"bindBufferRange() call failed.",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                              ,0x7eb);
              iVar6 = iVar6 + 1;
            } while (iVar6 < *local_270);
          }
          (**(code **)(lVar9 + 0x708))(1,&this->m_vao_id);
          dVar7 = (**(code **)(lVar9 + 0x800))();
          glu::checkError(dVar7,"glGenVertexArrays() call failed.",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                          ,0x7f0);
          (**(code **)(lVar9 + 0xd8))(this->m_vao_id);
          dVar7 = (**(code **)(lVar9 + 0x800))();
          glu::checkError(dVar7,"glBindVertexArray() call failed.",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                          ,0x7f3);
          pGVar1 = &this->m_tfbo_id;
          (**(code **)(lVar9 + 0x6c8))(1,pGVar1);
          dVar7 = (**(code **)(lVar9 + 0x800))();
          glu::checkError(dVar7,"glGenBuffers() call failed.",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                          ,0x7f7);
          (**(code **)(lVar9 + 0x40))(0x8892,*pGVar1);
          dVar7 = (**(code **)(lVar9 + 0x800))();
          glu::checkError(dVar7,"glBindBuffer() call failed.",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                          ,0x7fa);
          (**(code **)(lVar9 + 0x150))(0x8892,0x10,initial_buffer_data,0x88e5);
          dVar7 = (**(code **)(lVar9 + 0x800))();
          glu::checkError(dVar7,"glBufferData() call failed.",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                          ,0x7fe);
          (**(code **)(lVar9 + 0x48))(0x8c8e,0,*pGVar1);
          dVar7 = (**(code **)(lVar9 + 0x800))();
          glu::checkError(dVar7,"glBindBufferBase() call failed.",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                          ,0x802);
          (**(code **)(lVar9 + 0x1680))(this->m_po_id);
          dVar7 = (**(code **)(lVar9 + 0x800))();
          glu::checkError(dVar7,"glUseProgram() call failed.",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                          ,0x806);
          (**(code **)(lVar9 + 0x5e0))(0x8c89);
          dVar7 = (**(code **)(lVar9 + 0x800))();
          glu::checkError(dVar7,"glEnable() call failed for GL_RASTERIZER_DISCARD pname.",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                          ,0x80a);
          (**(code **)(lVar9 + 0x30))(0);
          dVar7 = (**(code **)(lVar9 + 0x800))();
          glu::checkError(dVar7,"glBeginTransformFeedback() call failed.",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                          ,0x80d);
          (**(code **)(lVar9 + 0x538))(0,0,1);
          dVar7 = (**(code **)(lVar9 + 0x800))();
          glu::checkError(dVar7,"glDrawArrays() call failed for GL_POINTS pname.",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                          ,0x810);
          (**(code **)(lVar9 + 0x638))();
          dVar7 = (**(code **)(lVar9 + 0x800))();
          glu::checkError(dVar7,"glEndTransformFeedback() call failed.",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                          ,0x813);
          (**(code **)(lVar9 + 0x4e8))(0x8c89);
          dVar7 = (**(code **)(lVar9 + 0x800))();
          glu::checkError(dVar7,"glDisable() call failed for GL_RASTERIZER_DISCARD pname.",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                          ,0x816);
          pfVar12 = (float *)(**(code **)(lVar9 + 0xd00))(0x8892,0,0x10,1);
          dVar7 = (**(code **)(lVar9 + 0x800))();
          glu::checkError(dVar7,"glMapBufferRange() call failed.",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                          ,0x81b);
          local_24c = *pfVar12;
          (**(code **)(lVar9 + 0x1670))(0x8892);
          dVar7 = (**(code **)(lVar9 + 0x800))();
          glu::checkError(dVar7,"glUnmapBuffer() call failed.",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                          ,0x820);
          piVar13 = (int *)(**(code **)(lVar9 + 0xd00))(0x90d2,0,local_260,1);
          dVar7 = (**(code **)(lVar9 + 0x800))();
          glu::checkError(dVar7,"glMapBufferRange() call failed.",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                          ,0x827);
          uVar14 = (ulong)*local_270;
          local_260 = CONCAT71(local_260._1_7_,(long)uVar14 < 1);
          if (0 < (long)uVar14) {
            if (*piVar13 == 2) {
              iVar6 = 0;
              uVar16 = 2;
              do {
                uVar15 = uVar16;
                if ((1 - uVar14) + uVar15 == 2) {
                  local_260 = CONCAT71(local_260._1_7_,uVar14 <= uVar15 - 1);
                  goto LAB_00d0119c;
                }
                iVar6 = iVar6 + local_250;
                lVar17 = (long)iVar6;
                uVar16 = uVar15 + 1;
              } while (uVar16 == (uint)piVar13[lVar17]);
              local_260 = CONCAT71(local_260._1_7_,uVar14 <= uVar15 - 1);
            }
            else {
              uVar16 = 2;
              iVar6 = 0;
              lVar17 = 0;
            }
            local_1b0 = (undefined1  [8])
                        ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"Value read from Shader Storage Buffer [",0x27);
            std::ostream::operator<<(local_1a8,piVar13[lVar17]);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"] at index [",0xc);
            std::ostream::operator<<((ostringstream *)local_1a8,iVar6);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"]is not equal to expected value [",0x21);
            std::ostream::operator<<((ostringstream *)local_1a8,(int)uVar16);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"]",1);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
            std::ios_base::~ios_base(local_138);
          }
LAB_00d0119c:
          (**(code **)(lVar9 + 0x1670))(0x90d2);
          dVar7 = (**(code **)(lVar9 + 0x800))();
          glu::checkError(dVar7,"glUnmapBuffer() call failed.",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                          ,0x83e);
          if (((byte)local_260 & (int)((*local_270 + 1U) * *local_270) / 2 == (int)(local_24c + 0.5)
              ) != 0) {
            description = "Pass";
            testResult = QP_TEST_RESULT_PASS;
            goto LAB_00d00bc1;
          }
          goto LAB_00d00bb5;
        }
        local_1b0 = (undefined1  [8])
                    ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"GL_SHADER_STORAGE_BUFFER_OFFSET_ALIGNMENT query value [",
                   0x37);
        std::ostream::operator<<((ostringstream *)local_1a8,ssbo_alignment);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"]divide with remainder by the size of GLint [",0x2d);
        std::ostream::operator<<((ostringstream *)local_1a8,4);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"]",1);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      }
      else {
        local_1b0 = (undefined1  [8])
                    ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"Program object linking failed.",0x1e);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      }
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
  }
LAB_00d00bb5:
  description = "Fail";
  testResult = QP_TEST_RESULT_FAIL;
LAB_00d00bc1:
  tcu::TestContext::setTestResult
            ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,testResult,
             description);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)vs_code_specialized._M_dataplus._M_p != &vs_code_specialized.field_2) {
    operator_delete(vs_code_specialized._M_dataplus._M_p,
                    vs_code_specialized.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)gs_code_specialized._M_dataplus._M_p != &gs_code_specialized.field_2) {
    operator_delete(gs_code_specialized._M_dataplus._M_p,
                    gs_code_specialized.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)fs_code_specialized._M_dataplus._M_p != &fs_code_specialized.field_2) {
    operator_delete(fs_code_specialized._M_dataplus._M_p,
                    fs_code_specialized.field_2._M_allocated_capacity + 1);
  }
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult GeometryShaderMaxShaderStorageBlocksTest::iterate()
{
	glw::GLint		   counter						 = 0;
	glw::GLint		   expectedValue				 = 0;
	const glw::GLchar* feedbackVaryings[]			 = { "gl_Position" };
	bool			   has_shader_compilation_failed = true;
	const glw::GLfloat initial_buffer_data[4]		 = { 0.0f, 0.0f, 0.0f, 0.0f };
	glw::GLint		   int_alignment				 = 0;
	const glw::GLint   int_size						 = sizeof(glw::GLint);
	glw::GLint*		   ptrSSBO_data					 = DE_NULL;
	glw::GLfloat*	  ptrTF_data					 = DE_NULL;
	bool			   result						 = true;
	glw::GLint		   ssbo_alignment				 = 0;
	glw::GLint*		   ssbo_data					 = DE_NULL;
	glw::GLint		   ssbo_data_size				 = 0;

	std::string fs_code_specialized		= "";
	const char* fs_code_specialized_raw = DE_NULL;
	std::string gs_code_specialized		= "";
	const char* gs_code_specialized_raw = DE_NULL;
	std::string vs_code_specialized		= "";
	const char* vs_code_specialized_raw = DE_NULL;

	/* This test should only run if EXT_geometry_shader is supported. */
	if (!m_is_geometry_shader_extension_supported)
	{
		throw tcu::NotSupportedError(GEOMETRY_SHADER_EXTENSION_NOT_SUPPORTED, "", __FILE__, __LINE__);
	}

	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Retrieve GL_MAX_GEOMETRY_SHADER_STORAGE_BLOCKS_EXT pname value */
	gl.getIntegerv(m_glExtTokens.MAX_GEOMETRY_SHADER_STORAGE_BLOCKS,
				   &m_gl_max_geometry_shader_storage_blocks_ext_value);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() failed for GL_MAX_GEOMETRY_SHADER_STORAGE_BLOCKS_EXT pname");

	/* Retrieve GL_MAX_SHADER_STORAGE_BUFFER_BINDINGS pname value */
	glw::GLint m_gl_max_shader_storage_buffer_bindings_value = 0;

	gl.getIntegerv(GL_MAX_SHADER_STORAGE_BUFFER_BINDINGS, &m_gl_max_shader_storage_buffer_bindings_value);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() failed for GL_MAX_SHADER_STORAGE_BUFFER_BINDINGS pname");

	/* Check if m_gl_max_shader_storage_blocks_value is less than or equal zero. */
	if (m_gl_max_geometry_shader_storage_blocks_ext_value <= 0)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "GL_MAX_GEOMETRY_SHADER_STORAGE_BLOCKS_EXT query value "
						   << "[" << m_gl_max_geometry_shader_storage_blocks_ext_value
						   << "]"
							  " is less than or equal zero. Shader Storage Blocks"
							  " in Geometry Shader are not supported."
						   << tcu::TestLog::EndMessage;

		if (m_gl_max_geometry_shader_storage_blocks_ext_value == 0)
		{
			throw tcu::NotSupportedError("GL_MAX_GEOMETRY_SHADER_STORAGE_BLOCKS_EXT is 0");
		}
		else
		{
			result = false;
			goto end;
		}
	}

	/* Check if m_gl_max_shader_storage_buffer_bindings_value is less than m_gl_max_shader_storage_blocks_value. */
	if (m_gl_max_shader_storage_buffer_bindings_value < m_gl_max_geometry_shader_storage_blocks_ext_value)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "GL_MAX_GEOMETRY_SHADER_STORAGE_BLOCKS_EXT query value "
						   << "[" << m_gl_max_geometry_shader_storage_blocks_ext_value
						   << "]"
							  " is greater than GL_MAX_SHADER_STORAGE_BUFFER_BINDINGS query value "
							  "["
						   << m_gl_max_shader_storage_buffer_bindings_value << "]." << tcu::TestLog::EndMessage;

		result = false;
		goto end;
	}

	/* Create a program object. */
	m_po_id = gl.createProgram();
	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateProgram() call failed.");

	/* Create shader objects. */
	m_fs_id = gl.createShader(GL_FRAGMENT_SHADER);
	m_gs_id = gl.createShader(GL_GEOMETRY_SHADER);
	m_vs_id = gl.createShader(GL_VERTEX_SHADER);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShader() call(s) failed.");

	/* Configure which outputs should be captured by Transform Feedback. */
	gl.transformFeedbackVaryings(m_po_id, 1 /* varyings count */, feedbackVaryings, GL_INTERLEAVED_ATTRIBS);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glTransformFeedbackVaryings() call failed.");

	/* Try to link the test program object */
	fs_code_specialized		= specializeShader(1, &dummy_fs_code);
	fs_code_specialized_raw = fs_code_specialized.c_str();

	gs_code_specialized		= getGSCode();
	gs_code_specialized_raw = gs_code_specialized.c_str();

	vs_code_specialized		= specializeShader(1, &dummy_vs_code);
	vs_code_specialized_raw = vs_code_specialized.c_str();

	if (!TestCaseBase::buildProgram(m_po_id, m_gs_id, 1,				  /* n_sh1_body_parts */
									&gs_code_specialized_raw, m_vs_id, 1, /* n_sh2_body_parts */
									&vs_code_specialized_raw, m_fs_id, 1, /* n_sh3_body_parts */
									&fs_code_specialized_raw, &has_shader_compilation_failed))
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Program object linking failed." << tcu::TestLog::EndMessage;

		result = false;
		goto end;
	}

	/* Prepare data for Shader Storage Buffer Object. */
	gl.getIntegerv(GL_SHADER_STORAGE_BUFFER_OFFSET_ALIGNMENT, &ssbo_alignment);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() call failed.");

	int_alignment  = ssbo_alignment / int_size;
	ssbo_data_size = m_gl_max_geometry_shader_storage_blocks_ext_value * ssbo_alignment;
	ssbo_data	  = new glw::GLint[ssbo_data_size];

	if ((ssbo_alignment % int_size) != 0)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "GL_SHADER_STORAGE_BUFFER_OFFSET_ALIGNMENT query value "
													   "["
						   << ssbo_alignment << "]"
												"divide with remainder by the size of GLint "
												"["
						   << int_size << "]" << tcu::TestLog::EndMessage;

		result = false;
		goto end;
	}

	for (int i = 0; i < m_gl_max_geometry_shader_storage_blocks_ext_value; ++i)
	{
		ssbo_data[i * int_alignment] = i + 1;
	}

	/* Create Shader Storage Buffer Object. */
	gl.genBuffers(1, &m_ssbo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenBuffers() call failed.");

	gl.bindBuffer(GL_SHADER_STORAGE_BUFFER, m_ssbo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer() call failed for GL_SHADER_STORAGE_BUFFER pname.");

	gl.bufferData(GL_SHADER_STORAGE_BUFFER, ssbo_data_size, ssbo_data, GL_DYNAMIC_COPY);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBufferData() call failed.");

	/* Free unused memory. */
	delete[] ssbo_data;
	ssbo_data = NULL;

	/* Bind specific m_ssbo_id buffer region to a specific Shader Storage Buffer binding point. */
	for (glw::GLint n_ssb = 0; n_ssb < (m_gl_max_geometry_shader_storage_blocks_ext_value); ++n_ssb)
	{
		glw::GLuint offset = n_ssb * ssbo_alignment;

		gl.bindBufferRange(GL_SHADER_STORAGE_BUFFER, n_ssb /*binding index*/, m_ssbo_id, offset, int_size);
		GLU_EXPECT_NO_ERROR(gl.getError(), "bindBufferRange() call failed.");
	}

	/* Configure VAO. */
	gl.genVertexArrays(1, &m_vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenVertexArrays() call failed.");

	gl.bindVertexArray(m_vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindVertexArray() call failed.");

	/* Create a Buffer Object for Transform Feedback's outputs. */
	gl.genBuffers(1, &m_tfbo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenBuffers() call failed.");

	gl.bindBuffer(GL_ARRAY_BUFFER, m_tfbo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer() call failed.");

	gl.bufferData(GL_ARRAY_BUFFER, sizeof(glw::GLfloat) * 4 /* four float vector components */, initial_buffer_data,
				  GL_STATIC_READ);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBufferData() call failed.");

	/* Bind Buffer Object m_tfbo_id to GL_TRANSFORM_FEEDBACK_BUFFER binding point. */
	gl.bindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 0 /*binding index*/, m_tfbo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBufferBase() call failed.");

	/* Use program. */
	gl.useProgram(m_po_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram() call failed.");

	/* Disable rasterization and make a draw call. After that, turn on rasterization. */
	gl.enable(GL_RASTERIZER_DISCARD);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glEnable() call failed for GL_RASTERIZER_DISCARD pname.");

	gl.beginTransformFeedback(GL_POINTS);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBeginTransformFeedback() call failed.");

	gl.drawArrays(GL_POINTS, 0 /*starting index*/, 1 /*number of indices*/);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glDrawArrays() call failed for GL_POINTS pname.");

	gl.endTransformFeedback();
	GLU_EXPECT_NO_ERROR(gl.getError(), "glEndTransformFeedback() call failed.");

	gl.disable(GL_RASTERIZER_DISCARD);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glDisable() call failed for GL_RASTERIZER_DISCARD pname.");

	/* Retrieve value from Transform Feedback. */
	ptrTF_data = (glw::GLfloat*)gl.mapBufferRange(
		GL_ARRAY_BUFFER, 0 /*offset*/, sizeof(glw::GLfloat) * 4 /* four float vector components */, GL_MAP_READ_BIT);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glMapBufferRange() call failed.");

	counter = int(ptrTF_data[0] + 0.5f);

	gl.unmapBuffer(GL_ARRAY_BUFFER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapBuffer() call failed.");

	ptrTF_data = NULL;

	/* Retrieve values from Shader Storage Buffer Object. */
	ptrSSBO_data =
		(glw::GLint*)gl.mapBufferRange(GL_SHADER_STORAGE_BUFFER, 0 /*offset*/, ssbo_data_size, GL_MAP_READ_BIT);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glMapBufferRange() call failed.");

	for (int i = 0; i < m_gl_max_geometry_shader_storage_blocks_ext_value; ++i)
	{
		if (ptrSSBO_data[i * int_alignment] != i + 2)
		{
			result = false;

			m_testCtx.getLog() << tcu::TestLog::Message << "Value read from Shader Storage Buffer "
														   "["
							   << ptrSSBO_data[i * int_alignment] << "] "
																	 "at index "
																	 "["
							   << i * int_alignment << "]"
													   "is not equal to expected value "
													   "["
							   << i + 2 << "]" << tcu::TestLog::EndMessage;

			break;
		}
	}

	gl.unmapBuffer(GL_SHADER_STORAGE_BUFFER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapBuffer() call failed.");

	ptrSSBO_data = NULL;

	/* Calculate expected value. */
	expectedValue =
		m_gl_max_geometry_shader_storage_blocks_ext_value * (m_gl_max_geometry_shader_storage_blocks_ext_value + 1) / 2;

	if (counter != expectedValue)
	{
		result = false;
	}

end:
	if (result)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	return STOP;
}